

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>::
Bind<cmCMakePresetsGraphInternal::AnyAllOfCondition,std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>>>,std::function<cmCMakePresetsGraph::ReadFileResult(std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>>>&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *this,string_view *name,
          offset_in_AnyAllOfCondition_to_vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
          member,function<cmCMakePresetsGraph::ReadFileResult_(std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *pOVar1;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  offset_in_AnyAllOfCondition_to_vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
  local_30;
  
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>_&,_const_Json::Value_*)>
  ::function((function<cmCMakePresetsGraph::ReadFileResult_(std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>_&,_const_Json::Value_*)>
              *)&local_50,func);
  local_30 = member;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::AnyAllOfCondition&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>::Bind<cmCMakePresetsGraphInternal::AnyAllOfCondition,std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>>>,std::function<cmCMakePresetsGraph::ReadFileResult(std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>>>&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>>>cmCMakePresetsGraphInternal::AnyAllOfCondition::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::vector<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>>>&,Json::Value_const*)>,bool)::_lambda(cmCMakePresetsGraphInternal::AnyAllOfCondition&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::AnyAllOfCondition&,Json::Value_const*)>
              *)local_70._M_pod_data,(anon_class_40_2_315d8239 *)&local_50);
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_70,required);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }